

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O0

void initialize(econf_file *key_file,size_t num)

{
  char *pcVar1;
  size_t num_local;
  econf_file *key_file_local;
  
  pcVar1 = setGroupList(key_file,"_none_");
  key_file->file_entry[num].group = pcVar1;
  pcVar1 = strdup("_none_");
  key_file->file_entry[num].key = pcVar1;
  pcVar1 = strdup("_none_");
  key_file->file_entry[num].value = pcVar1;
  key_file->file_entry[num].comment_before_key = (char *)0x0;
  key_file->file_entry[num].comment_after_value = (char *)0x0;
  key_file->file_entry[num].quotes = false;
  return;
}

Assistant:

void initialize(econf_file *key_file, size_t num) {
  key_file->file_entry[num].group = setGroupList(key_file, KEY_FILE_NULL_VALUE);
  key_file->file_entry[num].key = strdup(KEY_FILE_NULL_VALUE);
  key_file->file_entry[num].value = strdup(KEY_FILE_NULL_VALUE);
  key_file->file_entry[num].comment_before_key = NULL;
  key_file->file_entry[num].comment_after_value = NULL;
  key_file->file_entry[num].quotes = false;
}